

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O0

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2MinDistanceTarget *target,S2MinDistance *min_dist)

{
  bool bVar1;
  pointer pSVar2;
  Options *this_00;
  S2MinDistance SVar3;
  undefined1 local_40 [8];
  Result r;
  S2MinDistance *min_dist_local;
  S2MinDistanceTarget *target_local;
  S2MinDistanceShapeIndexTarget *this_local;
  
  pSVar2 = std::unique_ptr<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>::operator->
                     (&this->query_);
  this_00 = S2ClosestEdgeQuery::mutable_options(pSVar2);
  r._8_8_ = (min_dist->super_S1ChordAngle).length2_;
  S2ClosestEdgeQuery::Options::set_max_distance(this_00,(S1ChordAngle)r._8_8_);
  pSVar2 = std::unique_ptr<S2ClosestEdgeQuery,_std::default_delete<S2ClosestEdgeQuery>_>::operator->
                     (&this->query_);
  _local_40 = S2ClosestEdgeQuery::FindClosestEdge(pSVar2,target);
  bVar1 = S2ClosestEdgeQueryBase<S2MinDistance>::Result::is_empty((Result *)local_40);
  if (!bVar1) {
    SVar3 = S2ClosestEdgeQueryBase<S2MinDistance>::Result::distance((Result *)local_40);
    (min_dist->super_S1ChordAngle).length2_ = (double)SVar3;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    S2MinDistanceTarget* target, S2MinDistance* min_dist) {
  query_->mutable_options()->set_max_distance(*min_dist);
  S2ClosestEdgeQuery::Result r = query_->FindClosestEdge(target);
  if (r.is_empty()) return false;
  *min_dist = r.distance();
  return true;
}